

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::StdPropertyExtract_DynamicType
               (SnapObject *snpObject,DynamicObject *dynObj,SlabAllocator *alloc)

{
  uint uVar1;
  SnapType *pSVar2;
  SnapHandler *pSVar3;
  bool bVar4;
  int iVar5;
  void **dst;
  Type *src;
  Var *src_00;
  size_t sizeInBytes;
  anon_union_8_2_815e7e51_for_DynamicObject_2 aVar6;
  SnapHandler *sHandler;
  
  pSVar2 = snpObject->SnapType;
  iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(dynObj);
  snpObject->IsCrossSite = iVar5;
  pSVar3 = pSVar2->TypeHandlerInfo;
  uVar1 = pSVar3->MaxPropertyIndex;
  if ((ulong)uVar1 == 0) {
    snpObject->VarArrayCount = 0;
    snpObject->VarArray = (TTDVar *)0x0;
  }
  else {
    snpObject->VarArrayCount = uVar1;
    dst = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
    snpObject->VarArray = dst;
    if (pSVar3->InlineSlotCapacity != 0) {
      src = Js::DynamicObject::GetInlineSlots_TTD(dynObj);
      uVar1 = pSVar3->InlineSlotCapacity;
      if (pSVar3->MaxPropertyIndex < pSVar3->InlineSlotCapacity) {
        uVar1 = pSVar3->MaxPropertyIndex;
      }
      js_memcpy_s(dst,(ulong)uVar1 << 3,src,(ulong)uVar1 << 3);
    }
    uVar1 = pSVar3->InlineSlotCapacity;
    if (uVar1 < pSVar3->MaxPropertyIndex) {
      src_00 = Js::DynamicObject::GetAuxSlots_TTD(dynObj);
      sizeInBytes = (ulong)(pSVar3->MaxPropertyIndex - pSVar3->InlineSlotCapacity) << 3;
      js_memcpy_s(dst + uVar1,sizeInBytes,src_00,sizeInBytes);
    }
  }
  bVar4 = Js::DynamicObject::HasObjectArray(dynObj);
  aVar6 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
  if (bVar4) {
    aVar6 = dynObj->field_1;
  }
  snpObject->OptIndexedObjectArray = (TTD_PTR_ID)aVar6;
  snpObject->OptDependsOnInfo = (DependsOnInfo *)0x0;
  return;
}

Assistant:

void StdPropertyExtract_DynamicType(SnapObject* snpObject, Js::DynamicObject* dynObj, SlabAllocator& alloc)
        {
            NSSnapType::SnapType* sType = snpObject->SnapType;

            snpObject->IsCrossSite = dynObj->IsCrossSiteObject();

#if ENABLE_OBJECT_SOURCE_TRACKING
            CopyDiagnosticOriginInformation(snpObject->DiagOriginInfo, dynObj->TTDDiagOriginInfo);
#endif

            if(sType->TypeHandlerInfo->MaxPropertyIndex == 0)
            {
                snpObject->VarArrayCount = 0;
                snpObject->VarArray = nullptr;
            }
            else
            {
                NSSnapType::SnapHandler* sHandler = sType->TypeHandlerInfo;

                static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

                snpObject->VarArrayCount = sHandler->MaxPropertyIndex;
                snpObject->VarArray = alloc.SlabAllocateArray<TTDVar>(snpObject->VarArrayCount);

                TTDVar* cpyBase = snpObject->VarArray;
                if(sHandler->InlineSlotCapacity != 0)
                {
                    Field(Js::Var) const* inlineSlots = dynObj->GetInlineSlots_TTD();

                    //copy all the properties (if they all fit into the inline slots) otherwise just copy all the inline slot values
                    uint32 inlineSlotCount = min(sHandler->MaxPropertyIndex, sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, inlineSlotCount * sizeof(TTDVar), inlineSlots, inlineSlotCount * sizeof(Js::Var));
                }

                if(sHandler->MaxPropertyIndex > sHandler->InlineSlotCapacity)
                {
                    cpyBase = cpyBase + sHandler->InlineSlotCapacity;
                    Js::Var const* auxSlots = dynObj->GetAuxSlots_TTD();

                    //there are some values in aux slots (in addition to the inline slots) so copy them as well
                    uint32 auxSlotCount = (sHandler->MaxPropertyIndex - sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, auxSlotCount * sizeof(TTDVar), auxSlots, auxSlotCount * sizeof(Js::Var));
                }
            }

            Js::ArrayObject* parray = dynObj->GetObjectArray();
            snpObject->OptIndexedObjectArray = (parray == nullptr) ? TTD_INVALID_PTR_ID : TTD_CONVERT_VAR_TO_PTR_ID(parray);

            snpObject->OptDependsOnInfo = nullptr;
            //AddtlSnapObjectInfo must be set later in type specific extract code
        }